

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined4 uVar37;
  ulong uVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  size_t itime;
  ulong uVar47;
  int iVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar70;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar85;
  float fVar86;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar87;
  float fVar88;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar109;
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  undefined1 auVar106 [64];
  float fVar110;
  float fVar115;
  float fVar116;
  vfloat4 a0;
  float fVar117;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  float fVar123;
  float fVar124;
  vfloat4 a0_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar125;
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar126;
  float fVar127;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar136;
  float fVar137;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  undefined1 auVar140 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar149;
  float fVar151;
  undefined1 auVar147 [16];
  float fVar150;
  float fVar152;
  float fVar153;
  undefined1 auVar148 [32];
  float fVar154;
  float fVar157;
  float fVar158;
  Vec3fa n0;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar159;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar164;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar170;
  float fVar172;
  float fVar173;
  Vec3fa n1;
  undefined1 auVar171 [16];
  undefined1 auVar174 [32];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  size_t local_310;
  size_t local_308;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float fStack_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  anon_class_16_2_07cfa4d6 local_250;
  ulong local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float fStack_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 auStack_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [32];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar49._8_8_ = 0;
  auVar49._0_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar49._4_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar62._8_8_ = 0;
  auVar62._0_4_ = time_range->lower;
  auVar62._4_4_ = time_range->upper;
  auVar50 = vcmpps_avx(auVar49,auVar62,1);
  auVar51 = vinsertps_avx(auVar62,auVar49,0x50);
  auVar49 = vinsertps_avx(auVar49,auVar62,0x50);
  local_1e8 = vblendvps_avx(auVar49,auVar51,auVar50);
  local_1f8 = vmovshdup_avx(local_1e8);
  if (local_1e8._0_4_ <= local_1f8._0_4_) {
    uVar47 = r->_begin;
    local_2a8 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_2b8 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_2c8 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_2d8 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_310 = __return_storage_ptr__->end;
    if (uVar47 < r->_end) {
      auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar140 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar106 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar114 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      local_308 = k;
      do {
        BVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar50._8_8_ = 0;
        auVar50._0_4_ = BVar3.lower;
        auVar50._4_4_ = BVar3.upper;
        auVar50 = vmovshdup_avx(auVar50);
        fVar87 = BVar3.lower;
        fVar133 = auVar50._0_4_ - fVar87;
        uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar47);
        uVar38 = (ulong)(uVar4 + 3);
        pBVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 vertices.items;
        if (uVar38 < (pBVar5->super_RawBufferView).num) {
          fVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                  super_Geometry.fnumTimeSegments;
          auVar50 = ZEXT416((uint)(fVar2 * (((float)local_1e8._0_4_ - fVar87) / fVar133) * 1.0000002
                                  ));
          auVar50 = vroundss_avx(auVar50,auVar50,9);
          auVar50 = vmaxss_avx(auVar122._0_16_,auVar50);
          uVar42 = (uint)auVar50._0_4_;
          auVar50 = ZEXT416((uint)(fVar2 * (((float)local_1f8._0_4_ - fVar87) / fVar133) *
                                           0.99999976));
          auVar50 = vroundss_avx(auVar50,auVar50,10);
          auVar50 = vminss_avx(auVar50,ZEXT416((uint)fVar2));
          uVar44 = (uint)auVar50._0_4_;
          bVar9 = uVar44 < uVar42;
          if (uVar42 <= uVar44) {
            uVar43 = (ulong)(int)uVar42;
            pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry
                     .normals.items;
            fVar133 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                      super_CurveGeometry.maxRadiusScale;
            _fStack_210 = bezier_basis0._1640_8_;
            local_218 = (undefined1  [8])bezier_basis0._1632_8_;
            auVar50 = _local_218;
            _fStack_208 = bezier_basis0._1648_8_;
            uVar21 = _fStack_208;
            _fStack_200 = bezier_basis0._1656_8_;
            uVar22 = _fStack_200;
            local_238 = (float)bezier_basis0._2788_8_;
            fStack_234 = SUB84(bezier_basis0._2788_8_,4);
            fStack_230 = (float)bezier_basis0._2796_8_;
            fStack_22c = SUB84(bezier_basis0._2796_8_,4);
            _fStack_228 = bezier_basis0._2804_8_;
            uVar19 = _fStack_228;
            _fStack_220 = bezier_basis0._2812_8_;
            uVar20 = _fStack_220;
            local_198 = (float)bezier_basis0._3944_8_;
            fStack_194 = SUB84(bezier_basis0._3944_8_,4);
            fStack_190 = (float)bezier_basis0._3952_8_;
            fStack_18c = SUB84(bezier_basis0._3952_8_,4);
            _fStack_188 = bezier_basis0._3960_8_;
            uVar31 = _fStack_188;
            _fStack_180 = bezier_basis0._3968_8_;
            uVar32 = _fStack_180;
            _local_1d8 = bezier_basis0._5100_8_;
            uVar23 = _local_1d8;
            _fStack_1d0 = bezier_basis0._5108_8_;
            uVar24 = _fStack_1d0;
            _fStack_1c8 = bezier_basis0._5116_8_;
            uVar25 = _fStack_1c8;
            _fStack_1c0 = bezier_basis0._5124_8_;
            uVar26 = _fStack_1c0;
            _local_1b8 = bezier_basis0._6256_8_;
            uVar27 = _local_1b8;
            _fStack_1b0 = bezier_basis0._6264_8_;
            uVar28 = _fStack_1b0;
            _fStack_1a8 = bezier_basis0._6272_8_;
            uVar29 = _fStack_1a8;
            _fStack_1a0 = bezier_basis0._6280_8_;
            uVar30 = _fStack_1a0;
            _local_d8 = bezier_basis0._7412_8_;
            uVar33 = _local_d8;
            _fStack_d0 = bezier_basis0._7420_8_;
            uVar34 = _fStack_d0;
            _fStack_c8 = bezier_basis0._7428_8_;
            uVar35 = _fStack_c8;
            _fStack_c0 = bezier_basis0._7436_8_;
            uVar36 = _fStack_c0;
            local_f8 = (float)bezier_basis0._8568_8_;
            fStack_f4 = SUB84(bezier_basis0._8568_8_,4);
            fStack_f0 = (float)bezier_basis0._8576_8_;
            fStack_ec = SUB84(bezier_basis0._8576_8_,4);
            fStack_e8 = (float)bezier_basis0._8584_8_;
            fStack_e4 = SUB84(bezier_basis0._8584_8_,4);
            fStack_e0 = (float)bezier_basis0._8592_8_;
            uStack_dc = SUB84(bezier_basis0._8592_8_,4);
            lVar46 = uVar43 * 0x38 + 0x10;
            do {
              lVar7 = *(long *)((long)pBVar5 + lVar46 + -0x10);
              lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar46);
              lVar45 = lVar8 * (ulong)uVar4;
              lVar40 = lVar8 * (ulong)(uVar4 + 1);
              lVar41 = lVar8 * (ulong)(uVar4 + 2);
              auVar51 = vinsertps_avx(ZEXT416(*(uint *)(lVar7 + 0xc + lVar45)),
                                      ZEXT416(*(uint *)(lVar7 + 0xc + lVar40)),0x10);
              auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(lVar7 + 0xc + lVar41)),0x20);
              auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar38)),0x30)
              ;
              auVar63._8_4_ = 0x7fffffff;
              auVar63._0_8_ = 0x7fffffff7fffffff;
              auVar63._12_4_ = 0x7fffffff;
              auVar51 = vandps_avx(auVar51,auVar63);
              auVar49 = auVar106._0_16_;
              auVar51 = vcmpps_avx(auVar51,auVar49,5);
              _fStack_228 = bezier_basis0._2804_8_;
              _fStack_220 = bezier_basis0._2812_8_;
              _local_218 = auVar50;
              _fStack_208 = bezier_basis0._1648_8_;
              _fStack_200 = bezier_basis0._1656_8_;
              _local_1d8 = bezier_basis0._5100_8_;
              _fStack_1d0 = bezier_basis0._5108_8_;
              _fStack_1c8 = bezier_basis0._5116_8_;
              _fStack_1c0 = bezier_basis0._5124_8_;
              _local_1b8 = bezier_basis0._6256_8_;
              _fStack_1b0 = bezier_basis0._6264_8_;
              _fStack_1a8 = bezier_basis0._6272_8_;
              _fStack_1a0 = bezier_basis0._6280_8_;
              _fStack_188 = bezier_basis0._3960_8_;
              _fStack_180 = bezier_basis0._3968_8_;
              _local_d8 = bezier_basis0._7412_8_;
              _fStack_d0 = bezier_basis0._7420_8_;
              _fStack_c8 = bezier_basis0._7428_8_;
              _fStack_c0 = bezier_basis0._7436_8_;
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar51[0xf] < '\0') break;
              auVar51 = *(undefined1 (*) [16])(lVar7 + lVar45);
              auVar52 = auVar114._0_16_;
              auVar62 = vcmpps_avx(auVar51,auVar52,6);
              auVar63 = vcmpps_avx(auVar51,auVar49,1);
              auVar62 = vandps_avx(auVar62,auVar63);
              uVar37 = vmovmskps_avx(auVar62);
              _fStack_228 = uVar19;
              _fStack_220 = uVar20;
              _fStack_208 = uVar21;
              _fStack_200 = uVar22;
              _local_1d8 = uVar23;
              _fStack_1d0 = uVar24;
              _fStack_1c8 = uVar25;
              _fStack_1c0 = uVar26;
              _local_1b8 = uVar27;
              _fStack_1b0 = uVar28;
              _fStack_1a8 = uVar29;
              _fStack_1a0 = uVar30;
              _fStack_188 = uVar31;
              _fStack_180 = uVar32;
              _local_d8 = uVar33;
              _fStack_d0 = uVar34;
              _fStack_c8 = uVar35;
              _fStack_c0 = uVar36;
              if ((~(byte)uVar37 & 7) != 0) break;
              auVar62 = *(undefined1 (*) [16])(lVar7 + lVar40);
              auVar63 = vcmpps_avx(auVar62,auVar52,6);
              auVar54 = vcmpps_avx(auVar62,auVar49,1);
              auVar63 = vandps_avx(auVar63,auVar54);
              uVar37 = vmovmskps_avx(auVar63);
              if ((~(byte)uVar37 & 7) != 0) break;
              auVar63 = *(undefined1 (*) [16])(lVar7 + lVar41);
              auVar54 = vcmpps_avx(auVar63,auVar52,6);
              auVar53 = vcmpps_avx(auVar63,auVar49,1);
              auVar54 = vandps_avx(auVar54,auVar53);
              uVar37 = vmovmskps_avx(auVar54);
              if ((~(byte)uVar37 & 7) != 0) break;
              auVar54 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar38);
              auVar53 = vcmpps_avx(auVar54,auVar52,6);
              auVar56 = vcmpps_avx(auVar54,auVar49,1);
              auVar53 = vandps_avx(auVar53,auVar56);
              uVar37 = vmovmskps_avx(auVar53);
              if ((~(byte)uVar37 & 7) != 0) break;
              lVar7 = *(long *)((long)pBVar6 + lVar46 + -0x10);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar46);
              auVar53 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)uVar4);
              auVar56 = vcmpps_avx(auVar53,auVar52,6);
              auVar55 = vcmpps_avx(auVar53,auVar49,1);
              auVar56 = vandps_avx(auVar56,auVar55);
              uVar37 = vmovmskps_avx(auVar56);
              if ((~(byte)uVar37 & 7) != 0) break;
              auVar56 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)(uVar4 + 1));
              auVar52 = vcmpps_avx(auVar56,auVar52,6);
              auVar49 = vcmpps_avx(auVar56,auVar49,1);
              auVar49 = vandps_avx(auVar52,auVar49);
              uVar37 = vmovmskps_avx(auVar49);
              if ((~(byte)uVar37 & 7) != 0) break;
              auVar49 = vshufps_avx(auVar51,auVar51,0xff);
              auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)(auVar49._0_4_ * fVar133)),0x30);
              auVar49 = vshufps_avx(auVar62,auVar62,0xff);
              auVar49 = vinsertps_avx(auVar62,ZEXT416((uint)(auVar49._0_4_ * fVar133)),0x30);
              auVar62 = vshufps_avx(auVar63,auVar63,0xff);
              auVar62 = vinsertps_avx(auVar63,ZEXT416((uint)(auVar62._0_4_ * fVar133)),0x30);
              auVar63 = vshufps_avx(auVar54,auVar54,0xff);
              auVar63 = vinsertps_avx(auVar54,ZEXT416((uint)(auVar63._0_4_ * fVar133)),0x30);
              pfVar1 = (float *)(lVar7 + lVar8 * (ulong)(uVar4 + 2));
              fVar96 = *pfVar1;
              fVar97 = pfVar1[1];
              fVar98 = pfVar1[2];
              fVar107 = pfVar1[3];
              pfVar1 = (float *)(lVar7 + lVar8 * uVar38);
              fVar108 = *pfVar1;
              fVar109 = pfVar1[1];
              fVar110 = pfVar1[2];
              fVar115 = pfVar1[3];
              fVar87 = auVar63._0_4_;
              fVar72 = auVar63._4_4_;
              fVar134 = auVar63._8_4_;
              fVar116 = auVar140._8_4_ * fVar134;
              fVar86 = auVar63._12_4_;
              fVar117 = auVar140._12_4_ * fVar86;
              fVar125 = auVar62._0_4_;
              fVar127 = auVar62._4_4_;
              fVar132 = auVar62._8_4_;
              fVar135 = auVar62._12_4_;
              fVar70 = auVar49._0_4_;
              fVar126 = auVar49._4_4_;
              fVar136 = auVar49._8_4_;
              fVar88 = auVar49._12_4_;
              fVar71 = auVar51._0_4_;
              fVar131 = auVar51._4_4_;
              fVar85 = auVar51._8_4_;
              fVar95 = auVar51._12_4_;
              local_348._0_4_ =
                   fVar71 * 0.16666667 + fVar70 * 0.6666667 + fVar125 * 0.16666667 + fVar87 * 0.0;
              local_348._4_4_ =
                   fVar131 * 0.16666667 + fVar126 * 0.6666667 + fVar127 * 0.16666667 + fVar72 * 0.0;
              fStack_340 = fVar85 * 0.16666667 +
                           fVar136 * 0.6666667 + fVar132 * 0.16666667 + fVar116;
              fStack_33c = fVar95 * 0.16666667 + fVar88 * 0.6666667 + fVar135 * 0.16666667 + fVar117
              ;
              auVar111._0_4_ = fVar125 * 0.5 + fVar87 * 0.0;
              auVar111._4_4_ = fVar127 * 0.5 + fVar72 * 0.0;
              auVar111._8_4_ = fVar132 * 0.5 + fVar116;
              auVar111._12_4_ = fVar135 * 0.5 + fVar117;
              auVar118._0_4_ = fVar70 * 0.0;
              auVar118._4_4_ = fVar126 * 0.0;
              auVar118._8_4_ = fVar136 * 0.0;
              auVar118._12_4_ = fVar88 * 0.0;
              auVar51 = vsubps_avx(auVar111,auVar118);
              auVar119._0_4_ = fVar71 * 0.5;
              auVar119._4_4_ = fVar131 * 0.5;
              auVar119._8_4_ = fVar85 * 0.5;
              auVar119._12_4_ = fVar95 * 0.5;
              auVar79 = vsubps_avx(auVar51,auVar119);
              fVar137 = auVar56._0_4_;
              fVar141 = auVar56._4_4_;
              fVar142 = auVar56._8_4_;
              fVar146 = auVar56._12_4_;
              fVar116 = auVar53._0_4_;
              fVar117 = auVar53._4_4_;
              fVar123 = auVar53._8_4_;
              fVar124 = auVar53._12_4_;
              auVar112._0_4_ =
                   fVar116 * 0.16666667 + fVar137 * 0.6666667 + fVar96 * 0.16666667 + fVar108 * 0.0;
              auVar112._4_4_ =
                   fVar117 * 0.16666667 + fVar141 * 0.6666667 + fVar97 * 0.16666667 + fVar109 * 0.0;
              auVar112._8_4_ =
                   fVar123 * 0.16666667 + fVar142 * 0.6666667 + fVar98 * 0.16666667 + fVar110 * 0.0;
              auVar112._12_4_ =
                   fVar124 * 0.16666667 + fVar146 * 0.6666667 + fVar107 * 0.16666667 + fVar115 * 0.0
              ;
              auVar120._0_4_ = fVar96 * 0.5 + fVar108 * 0.0;
              auVar120._4_4_ = fVar97 * 0.5 + fVar109 * 0.0;
              auVar120._8_4_ = fVar98 * 0.5 + fVar110 * 0.0;
              auVar120._12_4_ = fVar107 * 0.5 + fVar115 * 0.0;
              auVar129._0_4_ = fVar137 * 0.0;
              auVar129._4_4_ = fVar141 * 0.0;
              auVar129._8_4_ = fVar142 * 0.0;
              auVar129._12_4_ = fVar146 * 0.0;
              auVar51 = vsubps_avx(auVar120,auVar129);
              auVar130._0_4_ = fVar116 * 0.5;
              auVar130._4_4_ = fVar117 * 0.5;
              auVar130._8_4_ = fVar123 * 0.5;
              auVar130._12_4_ = fVar124 * 0.5;
              auVar63 = vsubps_avx(auVar51,auVar130);
              auVar89._0_4_ = fVar71 * 0.0;
              auVar89._4_4_ = fVar131 * 0.0;
              auVar89._8_4_ = fVar85 * 0.0;
              auVar89._12_4_ = fVar95 * 0.0;
              auVar160._0_4_ =
                   auVar89._0_4_ + fVar70 * 0.16666667 + fVar125 * 0.6666667 + fVar87 * 0.16666667;
              auVar160._4_4_ =
                   auVar89._4_4_ + fVar126 * 0.16666667 + fVar127 * 0.6666667 + fVar72 * 0.16666667;
              auVar160._8_4_ =
                   auVar89._8_4_ + fVar136 * 0.16666667 + fVar132 * 0.6666667 + fVar134 * 0.16666667
              ;
              auVar160._12_4_ =
                   auVar89._12_4_ + fVar88 * 0.16666667 + fVar135 * 0.6666667 + fVar86 * 0.16666667;
              auVar99._0_4_ = fVar125 * 0.0 + fVar87 * 0.5;
              auVar99._4_4_ = fVar127 * 0.0 + fVar72 * 0.5;
              auVar99._8_4_ = fVar132 * 0.0 + fVar134 * 0.5;
              auVar99._12_4_ = fVar135 * 0.0 + fVar86 * 0.5;
              auVar74._0_4_ = fVar70 * 0.5;
              auVar74._4_4_ = fVar126 * 0.5;
              auVar74._8_4_ = fVar136 * 0.5;
              auVar74._12_4_ = fVar88 * 0.5;
              auVar51 = vsubps_avx(auVar99,auVar74);
              auVar74 = vsubps_avx(auVar51,auVar89);
              auVar90._0_4_ = fVar116 * 0.0;
              auVar90._4_4_ = fVar117 * 0.0;
              auVar90._8_4_ = fVar123 * 0.0;
              auVar90._12_4_ = fVar124 * 0.0;
              auVar75._0_4_ =
                   auVar90._0_4_ + fVar137 * 0.16666667 + fVar96 * 0.6666667 + fVar108 * 0.16666667;
              auVar75._4_4_ =
                   auVar90._4_4_ + fVar141 * 0.16666667 + fVar97 * 0.6666667 + fVar109 * 0.16666667;
              auVar75._8_4_ =
                   auVar90._8_4_ + fVar142 * 0.16666667 + fVar98 * 0.6666667 + fVar110 * 0.16666667;
              auVar75._12_4_ =
                   auVar90._12_4_ +
                   fVar146 * 0.16666667 + fVar107 * 0.6666667 + fVar115 * 0.16666667;
              auVar51._0_4_ = fVar96 * 0.0 + fVar108 * 0.5;
              auVar51._4_4_ = fVar97 * 0.0 + fVar109 * 0.5;
              auVar51._8_4_ = fVar98 * 0.0 + fVar110 * 0.5;
              auVar51._12_4_ = fVar107 * 0.0 + fVar115 * 0.5;
              auVar64._0_4_ = fVar137 * 0.5;
              auVar64._4_4_ = fVar141 * 0.5;
              auVar64._8_4_ = fVar142 * 0.5;
              auVar64._12_4_ = fVar146 * 0.5;
              auVar51 = vsubps_avx(auVar51,auVar64);
              auVar54 = vsubps_avx(auVar51,auVar90);
              auVar51 = vshufps_avx(auVar79,auVar79,0xc9);
              auVar49 = vshufps_avx(auVar112,auVar112,0xc9);
              fVar142 = auVar79._0_4_;
              auVar91._0_4_ = fVar142 * auVar49._0_4_;
              fVar149 = auVar79._4_4_;
              auVar91._4_4_ = fVar149 * auVar49._4_4_;
              fVar151 = auVar79._8_4_;
              auVar91._8_4_ = fVar151 * auVar49._8_4_;
              fVar153 = auVar79._12_4_;
              auVar91._12_4_ = fVar153 * auVar49._12_4_;
              auVar100._0_4_ = auVar112._0_4_ * auVar51._0_4_;
              auVar100._4_4_ = auVar112._4_4_ * auVar51._4_4_;
              auVar100._8_4_ = auVar112._8_4_ * auVar51._8_4_;
              auVar100._12_4_ = auVar112._12_4_ * auVar51._12_4_;
              auVar49 = vsubps_avx(auVar100,auVar91);
              auVar62 = vshufps_avx(auVar49,auVar49,0xc9);
              auVar49 = vshufps_avx(auVar63,auVar63,0xc9);
              auVar101._0_4_ = fVar142 * auVar49._0_4_;
              auVar101._4_4_ = fVar149 * auVar49._4_4_;
              auVar101._8_4_ = fVar151 * auVar49._8_4_;
              auVar101._12_4_ = fVar153 * auVar49._12_4_;
              auVar52._0_4_ = auVar63._0_4_ * auVar51._0_4_;
              auVar52._4_4_ = auVar63._4_4_ * auVar51._4_4_;
              auVar52._8_4_ = auVar63._8_4_ * auVar51._8_4_;
              auVar52._12_4_ = auVar63._12_4_ * auVar51._12_4_;
              auVar51 = vsubps_avx(auVar52,auVar101);
              auVar63 = vshufps_avx(auVar51,auVar51,0xc9);
              auVar51 = vshufps_avx(auVar74,auVar74,0xc9);
              auVar49 = vshufps_avx(auVar75,auVar75,0xc9);
              fVar164 = auVar74._0_4_;
              auVar53._0_4_ = fVar164 * auVar49._0_4_;
              fVar167 = auVar74._4_4_;
              auVar53._4_4_ = fVar167 * auVar49._4_4_;
              fVar168 = auVar74._8_4_;
              auVar53._8_4_ = fVar168 * auVar49._8_4_;
              fVar169 = auVar74._12_4_;
              auVar53._12_4_ = fVar169 * auVar49._12_4_;
              auVar76._0_4_ = auVar75._0_4_ * auVar51._0_4_;
              auVar76._4_4_ = auVar75._4_4_ * auVar51._4_4_;
              auVar76._8_4_ = auVar75._8_4_ * auVar51._8_4_;
              auVar76._12_4_ = auVar75._12_4_ * auVar51._12_4_;
              auVar49 = vsubps_avx(auVar76,auVar53);
              auVar52 = vshufps_avx(auVar49,auVar49,0xc9);
              auVar49 = vshufps_avx(auVar54,auVar54,0xc9);
              auVar77._0_4_ = fVar164 * auVar49._0_4_;
              auVar77._4_4_ = fVar167 * auVar49._4_4_;
              auVar77._8_4_ = fVar168 * auVar49._8_4_;
              auVar77._12_4_ = fVar169 * auVar49._12_4_;
              auVar65._0_4_ = auVar54._0_4_ * auVar51._0_4_;
              auVar65._4_4_ = auVar54._4_4_ * auVar51._4_4_;
              auVar65._8_4_ = auVar54._8_4_ * auVar51._8_4_;
              auVar65._12_4_ = auVar54._12_4_ * auVar51._12_4_;
              auVar51 = vsubps_avx(auVar65,auVar77);
              auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
              auVar51 = vdpps_avx(auVar62,auVar62,0x7f);
              fVar126 = auVar51._0_4_;
              auVar56 = ZEXT416((uint)fVar126);
              auVar49 = vrsqrtss_avx(auVar56,auVar56);
              fVar87 = auVar49._0_4_;
              auVar49 = vdpps_avx(auVar62,auVar63,0x7f);
              auVar53 = ZEXT416((uint)(fVar87 * 1.5 - fVar126 * 0.5 * fVar87 * fVar87 * fVar87));
              auVar53 = vshufps_avx(auVar53,auVar53,0);
              fVar87 = auVar53._0_4_ * auVar62._0_4_;
              fVar70 = auVar53._4_4_ * auVar62._4_4_;
              fVar71 = auVar53._8_4_ * auVar62._8_4_;
              fVar72 = auVar53._12_4_ * auVar62._12_4_;
              auVar51 = vshufps_avx(auVar51,auVar51,0);
              auVar102._0_4_ = auVar51._0_4_ * auVar63._0_4_;
              auVar102._4_4_ = auVar51._4_4_ * auVar63._4_4_;
              auVar102._8_4_ = auVar51._8_4_ * auVar63._8_4_;
              auVar102._12_4_ = auVar51._12_4_ * auVar63._12_4_;
              auVar51 = vshufps_avx(auVar49,auVar49,0);
              auVar92._0_4_ = auVar51._0_4_ * auVar62._0_4_;
              auVar92._4_4_ = auVar51._4_4_ * auVar62._4_4_;
              auVar92._8_4_ = auVar51._8_4_ * auVar62._8_4_;
              auVar92._12_4_ = auVar51._12_4_ * auVar62._12_4_;
              auVar64 = vsubps_avx(auVar102,auVar92);
              auVar51 = vrcpss_avx(auVar56,auVar56);
              auVar51 = ZEXT416((uint)(auVar51._0_4_ * (2.0 - fVar126 * auVar51._0_4_)));
              auVar63 = vshufps_avx(auVar51,auVar51,0);
              auVar49 = vdpps_avx(auVar52,auVar52,0x7f);
              auVar51 = vblendps_avx(auVar49,_DAT_01feba10,0xe);
              auVar62 = vrsqrtss_avx(auVar51,auVar51);
              fVar126 = auVar62._0_4_;
              auVar62 = ZEXT416((uint)(fVar126 * 1.5 -
                                      auVar49._0_4_ * 0.5 * fVar126 * fVar126 * fVar126));
              auVar56 = vshufps_avx(auVar62,auVar62,0);
              fVar126 = auVar52._0_4_ * auVar56._0_4_;
              fVar131 = auVar52._4_4_ * auVar56._4_4_;
              fVar134 = auVar52._8_4_ * auVar56._8_4_;
              fVar136 = auVar52._12_4_ * auVar56._12_4_;
              auVar62 = vdpps_avx(auVar52,auVar54,0x7f);
              auVar55 = vshufps_avx(auVar49,auVar49,0);
              auVar78._0_4_ = auVar55._0_4_ * auVar54._0_4_;
              auVar78._4_4_ = auVar55._4_4_ * auVar54._4_4_;
              auVar78._8_4_ = auVar55._8_4_ * auVar54._8_4_;
              auVar78._12_4_ = auVar55._12_4_ * auVar54._12_4_;
              auVar62 = vshufps_avx(auVar62,auVar62,0);
              auVar54._0_4_ = auVar62._0_4_ * auVar52._0_4_;
              auVar54._4_4_ = auVar62._4_4_ * auVar52._4_4_;
              auVar54._8_4_ = auVar62._8_4_ * auVar52._8_4_;
              auVar54._12_4_ = auVar62._12_4_ * auVar52._12_4_;
              auVar52 = vsubps_avx(auVar78,auVar54);
              auVar51 = vrcpss_avx(auVar51,auVar51);
              auVar51 = ZEXT416((uint)(auVar51._0_4_ * (2.0 - auVar49._0_4_ * auVar51._0_4_)));
              auVar51 = vshufps_avx(auVar51,auVar51,0);
              auVar49 = vshufps_avx(_local_348,_local_348,0xff);
              auVar103._0_4_ = auVar49._0_4_ * fVar87;
              auVar103._4_4_ = auVar49._4_4_ * fVar70;
              auVar103._8_4_ = auVar49._8_4_ * fVar71;
              auVar103._12_4_ = auVar49._12_4_ * fVar72;
              auVar54 = vsubps_avx(_local_348,auVar103);
              auVar62 = vshufps_avx(auVar79,auVar79,0xff);
              auVar66._0_4_ =
                   auVar62._0_4_ * fVar87 +
                   auVar49._0_4_ * auVar53._0_4_ * auVar64._0_4_ * auVar63._0_4_;
              auVar66._4_4_ =
                   auVar62._4_4_ * fVar70 +
                   auVar49._4_4_ * auVar53._4_4_ * auVar64._4_4_ * auVar63._4_4_;
              auVar66._8_4_ =
                   auVar62._8_4_ * fVar71 +
                   auVar49._8_4_ * auVar53._8_4_ * auVar64._8_4_ * auVar63._8_4_;
              auVar66._12_4_ =
                   auVar62._12_4_ * fVar72 +
                   auVar49._12_4_ * auVar53._12_4_ * auVar64._12_4_ * auVar63._12_4_;
              auVar63 = vsubps_avx(auVar79,auVar66);
              local_348._0_4_ = (float)local_348._0_4_ + auVar103._0_4_;
              local_348._4_4_ = (float)local_348._4_4_ + auVar103._4_4_;
              fStack_340 = fStack_340 + auVar103._8_4_;
              fStack_33c = fStack_33c + auVar103._12_4_;
              auVar49 = vshufps_avx(auVar160,auVar160,0xff);
              auVar104._0_4_ = auVar49._0_4_ * fVar126;
              auVar104._4_4_ = auVar49._4_4_ * fVar131;
              auVar104._8_4_ = auVar49._8_4_ * fVar134;
              auVar104._12_4_ = auVar49._12_4_ * fVar136;
              auVar53 = vsubps_avx(auVar160,auVar104);
              auVar62 = vshufps_avx(auVar74,auVar74,0xff);
              auVar55._0_4_ =
                   auVar62._0_4_ * fVar126 +
                   auVar49._0_4_ * auVar56._0_4_ * auVar52._0_4_ * auVar51._0_4_;
              auVar55._4_4_ =
                   auVar62._4_4_ * fVar131 +
                   auVar49._4_4_ * auVar56._4_4_ * auVar52._4_4_ * auVar51._4_4_;
              auVar55._8_4_ =
                   auVar62._8_4_ * fVar134 +
                   auVar49._8_4_ * auVar56._8_4_ * auVar52._8_4_ * auVar51._8_4_;
              auVar55._12_4_ =
                   auVar62._12_4_ * fVar136 +
                   auVar49._12_4_ * auVar56._12_4_ * auVar52._12_4_ * auVar51._12_4_;
              auVar51 = vsubps_avx(auVar74,auVar55);
              local_338._4_4_ = auVar160._4_4_ + auVar104._4_4_;
              local_338._0_4_ = auVar160._0_4_ + auVar104._0_4_;
              fStack_330 = auVar160._8_4_ + auVar104._8_4_;
              fStack_32c = auVar160._12_4_ + auVar104._12_4_;
              auVar56._0_4_ = auVar54._0_4_ + auVar63._0_4_ * 0.33333334;
              auVar56._4_4_ = auVar54._4_4_ + auVar63._4_4_ * 0.33333334;
              auVar56._8_4_ = auVar54._8_4_ + auVar63._8_4_ * 0.33333334;
              auVar56._12_4_ = auVar54._12_4_ + auVar63._12_4_ * 0.33333334;
              auVar79._0_4_ = auVar51._0_4_ * 0.33333334;
              auVar79._4_4_ = auVar51._4_4_ * 0.33333334;
              auVar79._8_4_ = auVar51._8_4_ * 0.33333334;
              auVar79._12_4_ = auVar51._12_4_ * 0.33333334;
              auVar62 = vsubps_avx(auVar53,auVar79);
              auVar51 = vshufps_avx(auVar62,auVar62,0);
              auVar49 = vshufps_avx(auVar62,auVar62,0x55);
              auStack_108 = vshufps_avx(auVar62,auVar62,0xaa);
              auVar62 = vshufps_avx(auVar53,auVar53,0);
              auVar63 = vshufps_avx(auVar53,auVar53,0x55);
              auVar52 = vshufps_avx(auVar53,auVar53,0xaa);
              fStack_188 = (float)bezier_basis0._3960_8_;
              fStack_184 = SUB84(bezier_basis0._3960_8_,4);
              fStack_180 = (float)bezier_basis0._3968_8_;
              fVar115 = auVar62._0_4_;
              fVar116 = auVar62._4_4_;
              fVar117 = auVar62._8_4_;
              fVar123 = auVar62._12_4_;
              fVar95 = auVar63._0_4_;
              fVar96 = auVar63._4_4_;
              fVar97 = auVar63._8_4_;
              fVar98 = auVar63._12_4_;
              fVar107 = auVar52._0_4_;
              fVar108 = auVar52._4_4_;
              fVar109 = auVar52._8_4_;
              fVar110 = auVar52._12_4_;
              fStack_228 = (float)bezier_basis0._2804_8_;
              fStack_224 = SUB84(bezier_basis0._2804_8_,4);
              fStack_220 = (float)bezier_basis0._2812_8_;
              fVar124 = auVar51._0_4_;
              fVar125 = auVar51._4_4_;
              fVar127 = auVar51._8_4_;
              fVar132 = auVar51._12_4_;
              fVar135 = auVar49._0_4_;
              fVar137 = auVar49._4_4_;
              fVar141 = auVar49._8_4_;
              fVar85 = auStack_108._0_4_;
              fVar86 = auStack_108._4_4_;
              fVar88 = auStack_108._8_4_;
              auVar51 = vshufps_avx(auVar56,auVar56,0);
              local_218._0_4_ = (undefined4)bezier_basis0._1632_8_;
              local_218._4_4_ = SUB84(bezier_basis0._1632_8_,4);
              fStack_210 = (float)bezier_basis0._1640_8_;
              fStack_20c = SUB84(bezier_basis0._1640_8_,4);
              fStack_208 = (float)bezier_basis0._1648_8_;
              fStack_204 = SUB84(bezier_basis0._1648_8_,4);
              fStack_200 = (float)bezier_basis0._1656_8_;
              fVar146 = auVar51._0_4_;
              fVar150 = auVar51._4_4_;
              fVar152 = auVar51._8_4_;
              fVar136 = fVar132 + 0.0 + 0.0;
              auVar62 = vshufps_avx(auVar56,auVar56,0x55);
              fVar154 = auVar62._0_4_;
              fVar157 = auVar62._4_4_;
              fVar158 = auVar62._8_4_;
              auVar63 = vshufps_avx(auVar56,auVar56,0xaa);
              fVar159 = auVar63._0_4_;
              fVar162 = auVar63._4_4_;
              fVar163 = auVar63._8_4_;
              auVar52 = vshufps_avx(auVar54,auVar54,0);
              local_2f8 = (float)bezier_basis0._476_8_;
              fStack_2f4 = SUB84(bezier_basis0._476_8_,4);
              fStack_2f0 = (float)bezier_basis0._484_8_;
              fStack_2ec = SUB84(bezier_basis0._484_8_,4);
              fStack_2e8 = (float)bezier_basis0._492_8_;
              fStack_2e4 = SUB84(bezier_basis0._492_8_,4);
              fStack_2e0 = (float)bezier_basis0._500_8_;
              fVar87 = auVar52._0_4_;
              fVar71 = auVar52._4_4_;
              fVar126 = auVar52._8_4_;
              fVar134 = auVar52._12_4_;
              auVar174._0_4_ =
                   local_2f8 * fVar87 +
                   fVar146 * (float)local_218._0_4_ + fVar124 * local_238 + fVar115 * local_198;
              auVar174._4_4_ =
                   fStack_2f4 * fVar71 +
                   fVar150 * (float)local_218._4_4_ + fVar125 * fStack_234 + fVar116 * fStack_194;
              auVar174._8_4_ =
                   fStack_2f0 * fVar126 +
                   fVar152 * fStack_210 + fVar127 * fStack_230 + fVar117 * fStack_190;
              auVar174._12_4_ =
                   fStack_2ec * fVar134 +
                   auVar51._12_4_ * fStack_20c + fVar132 * fStack_22c + fVar123 * fStack_18c;
              auVar174._16_4_ =
                   fStack_2e8 * fVar87 +
                   fVar146 * fStack_208 + fVar124 * fStack_228 + fVar115 * fStack_188;
              auVar174._20_4_ =
                   fStack_2e4 * fVar71 +
                   fVar150 * fStack_204 + fVar125 * fStack_224 + fVar116 * fStack_184;
              auVar174._24_4_ =
                   fStack_2e0 * fVar126 +
                   fVar152 * fStack_200 + fVar127 * fStack_220 + fVar117 * fStack_180;
              auVar174._28_4_ = fVar136 + 0.0;
              auVar52 = vshufps_avx(auVar54,auVar54,0x55);
              fVar70 = auVar52._0_4_;
              fVar72 = auVar52._4_4_;
              fVar131 = auVar52._8_4_;
              auVar138._0_4_ =
                   fVar154 * (float)local_218._0_4_ + fVar135 * local_238 + fVar95 * local_198 +
                   local_2f8 * fVar70;
              auVar138._4_4_ =
                   fVar157 * (float)local_218._4_4_ + fVar137 * fStack_234 + fVar96 * fStack_194 +
                   fStack_2f4 * fVar72;
              auVar138._8_4_ =
                   fVar158 * fStack_210 + fVar141 * fStack_230 + fVar97 * fStack_190 +
                   fStack_2f0 * fVar131;
              auVar138._12_4_ =
                   auVar62._12_4_ * fStack_20c + auVar49._12_4_ * fStack_22c + fVar98 * fStack_18c +
                   fStack_2ec * auVar52._12_4_;
              auVar138._16_4_ =
                   fVar154 * fStack_208 + fVar135 * fStack_228 + fVar95 * fStack_188 +
                   fStack_2e8 * fVar70;
              auVar138._20_4_ =
                   fVar157 * fStack_204 + fVar137 * fStack_224 + fVar96 * fStack_184 +
                   fStack_2e4 * fVar72;
              auVar138._24_4_ =
                   fVar158 * fStack_200 + fVar141 * fStack_220 + fVar97 * fStack_180 +
                   fStack_2e0 * fVar131;
              auVar138._28_4_ = fVar132 + 0.0 + 0.0 + fVar136;
              auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
              fVar170 = auVar54._0_4_;
              fVar172 = auVar54._4_4_;
              fVar173 = auVar54._8_4_;
              auVar165._0_4_ =
                   fVar170 * local_2f8 +
                   fVar107 * local_198 + fVar85 * local_238 + fVar159 * (float)local_218._0_4_;
              auVar165._4_4_ =
                   fVar172 * fStack_2f4 +
                   fVar108 * fStack_194 + fVar86 * fStack_234 + fVar162 * (float)local_218._4_4_;
              auVar165._8_4_ =
                   fVar173 * fStack_2f0 +
                   fVar109 * fStack_190 + fVar88 * fStack_230 + fVar163 * fStack_210;
              auVar165._12_4_ =
                   auVar54._12_4_ * fStack_2ec +
                   fVar110 * fStack_18c + auStack_108._12_4_ * fStack_22c +
                   auVar63._12_4_ * fStack_20c;
              auVar165._16_4_ =
                   fVar170 * fStack_2e8 +
                   fVar107 * fStack_188 + fVar85 * fStack_228 + fVar159 * fStack_208;
              auVar165._20_4_ =
                   fVar172 * fStack_2e4 +
                   fVar108 * fStack_184 + fVar86 * fStack_224 + fVar162 * fStack_204;
              auVar165._24_4_ =
                   fVar173 * fStack_2e0 +
                   fVar109 * fStack_180 + fVar88 * fStack_220 + fVar163 * fStack_200;
              auVar165._28_4_ = 0;
              local_d8 = (float)bezier_basis0._7412_8_;
              fStack_d4 = SUB84(bezier_basis0._7412_8_,4);
              fStack_d0 = (float)bezier_basis0._7420_8_;
              fStack_cc = SUB84(bezier_basis0._7420_8_,4);
              fStack_c8 = (float)bezier_basis0._7428_8_;
              fStack_c4 = SUB84(bezier_basis0._7428_8_,4);
              fStack_c0 = (float)bezier_basis0._7436_8_;
              local_1b8 = (float)bezier_basis0._6256_8_;
              fStack_1b4 = SUB84(bezier_basis0._6256_8_,4);
              fStack_1b0 = (float)bezier_basis0._6264_8_;
              fStack_1ac = SUB84(bezier_basis0._6264_8_,4);
              fStack_1a8 = (float)bezier_basis0._6272_8_;
              fStack_1a4 = SUB84(bezier_basis0._6272_8_,4);
              fStack_1a0 = (float)bezier_basis0._6280_8_;
              fStack_19c = SUB84(bezier_basis0._6280_8_,4);
              fVar136 = fVar123 + fVar123 + 0.0;
              local_1d8 = (float)bezier_basis0._5100_8_;
              fStack_1d4 = SUB84(bezier_basis0._5100_8_,4);
              fStack_1d0 = (float)bezier_basis0._5108_8_;
              fStack_1cc = SUB84(bezier_basis0._5108_8_,4);
              fStack_1c8 = (float)bezier_basis0._5116_8_;
              fStack_1c4 = SUB84(bezier_basis0._5116_8_,4);
              fStack_1c0 = (float)bezier_basis0._5124_8_;
              auVar81._0_4_ =
                   fVar87 * local_1d8 +
                   fVar146 * local_1b8 + local_d8 * fVar124 + fVar115 * local_f8;
              auVar81._4_4_ =
                   fVar71 * fStack_1d4 +
                   fVar150 * fStack_1b4 + fStack_d4 * fVar125 + fVar116 * fStack_f4;
              auVar81._8_4_ =
                   fVar126 * fStack_1d0 +
                   fVar152 * fStack_1b0 + fStack_d0 * fVar127 + fVar117 * fStack_f0;
              auVar81._12_4_ =
                   fVar134 * fStack_1cc +
                   auVar51._12_4_ * fStack_1ac + fStack_cc * fVar132 + fVar123 * fStack_ec;
              auVar81._16_4_ =
                   fVar87 * fStack_1c8 +
                   fVar146 * fStack_1a8 + fStack_c8 * fVar124 + fVar115 * fStack_e8;
              auVar81._20_4_ =
                   fVar71 * fStack_1c4 +
                   fVar150 * fStack_1a4 + fStack_c4 * fVar125 + fVar116 * fStack_e4;
              auVar81._24_4_ =
                   fVar126 * fStack_1c0 +
                   fVar152 * fStack_1a0 + fStack_c0 * fVar127 + fVar117 * fStack_e0;
              auVar81._28_4_ = fVar134 + fVar136;
              auVar58._0_4_ =
                   fVar70 * local_1d8 + fVar154 * local_1b8 + fVar135 * local_d8 + fVar95 * local_f8
              ;
              auVar58._4_4_ =
                   fVar72 * fStack_1d4 +
                   fVar157 * fStack_1b4 + fVar137 * fStack_d4 + fVar96 * fStack_f4;
              auVar58._8_4_ =
                   fVar131 * fStack_1d0 +
                   fVar158 * fStack_1b0 + fVar141 * fStack_d0 + fVar97 * fStack_f0;
              auVar58._12_4_ =
                   auVar52._12_4_ * fStack_1cc +
                   auVar62._12_4_ * fStack_1ac + auVar49._12_4_ * fStack_cc + fVar98 * fStack_ec;
              auVar58._16_4_ =
                   fVar70 * fStack_1c8 +
                   fVar154 * fStack_1a8 + fVar135 * fStack_c8 + fVar95 * fStack_e8;
              auVar58._20_4_ =
                   fVar72 * fStack_1c4 +
                   fVar157 * fStack_1a4 + fVar137 * fStack_c4 + fVar96 * fStack_e4;
              auVar58._24_4_ =
                   fVar131 * fStack_1c0 +
                   fVar158 * fStack_1a0 + fVar141 * fStack_c0 + fVar97 * fStack_e0;
              auVar58._28_4_ = fStack_19c + fVar123 + fVar123 + fVar98;
              auVar93._0_4_ =
                   fVar170 * local_1d8 +
                   fVar159 * local_1b8 + local_d8 * fVar85 + fVar107 * local_f8;
              auVar93._4_4_ =
                   fVar172 * fStack_1d4 +
                   fVar162 * fStack_1b4 + fStack_d4 * fVar86 + fVar108 * fStack_f4;
              auVar93._8_4_ =
                   fVar173 * fStack_1d0 +
                   fVar163 * fStack_1b0 + fStack_d0 * fVar88 + fVar109 * fStack_f0;
              auVar93._12_4_ =
                   auVar54._12_4_ * fStack_1cc +
                   auVar63._12_4_ * fStack_1ac +
                   fStack_cc * auStack_108._12_4_ + fVar110 * fStack_ec;
              auVar93._16_4_ =
                   fVar170 * fStack_1c8 +
                   fVar159 * fStack_1a8 + fStack_c8 * fVar85 + fVar107 * fStack_e8;
              auVar93._20_4_ =
                   fVar172 * fStack_1c4 +
                   fVar162 * fStack_1a4 + fStack_c4 * fVar86 + fVar108 * fStack_e4;
              auVar93._24_4_ =
                   fVar173 * fStack_1c0 +
                   fVar163 * fStack_1a0 + fStack_c0 * fVar88 + fVar109 * fStack_e0;
              auVar93._28_4_ = fVar136 + fVar123 + fVar123 + fVar110;
              auVar10 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,1);
              auVar11 = vblendps_avx(auVar58,ZEXT832(0) << 0x20,1);
              auVar144 = ZEXT832(0) << 0x20;
              auVar139 = vblendps_avx(auVar93,auVar144,1);
              auVar121._4_4_ = auVar10._4_4_ * 0.055555556;
              auVar121._0_4_ = auVar10._0_4_ * 0.055555556;
              auVar121._8_4_ = auVar10._8_4_ * 0.055555556;
              auVar121._12_4_ = auVar10._12_4_ * 0.055555556;
              auVar121._16_4_ = auVar10._16_4_ * 0.055555556;
              auVar121._20_4_ = auVar10._20_4_ * 0.055555556;
              auVar121._24_4_ = auVar10._24_4_ * 0.055555556;
              auVar121._28_4_ = auVar10._28_4_;
              auVar10._4_4_ = auVar11._4_4_ * 0.055555556;
              auVar10._0_4_ = auVar11._0_4_ * 0.055555556;
              auVar10._8_4_ = auVar11._8_4_ * 0.055555556;
              auVar10._12_4_ = auVar11._12_4_ * 0.055555556;
              auVar10._16_4_ = auVar11._16_4_ * 0.055555556;
              auVar10._20_4_ = auVar11._20_4_ * 0.055555556;
              auVar10._24_4_ = auVar11._24_4_ * 0.055555556;
              auVar10._28_4_ = auVar11._28_4_;
              auVar11._4_4_ = auVar139._4_4_ * 0.055555556;
              auVar11._0_4_ = auVar139._0_4_ * 0.055555556;
              auVar11._8_4_ = auVar139._8_4_ * 0.055555556;
              auVar11._12_4_ = auVar139._12_4_ * 0.055555556;
              auVar11._16_4_ = auVar139._16_4_ * 0.055555556;
              auVar11._20_4_ = auVar139._20_4_ * 0.055555556;
              auVar11._24_4_ = auVar139._24_4_ * 0.055555556;
              auVar11._28_4_ = auVar139._28_4_;
              auVar121 = vsubps_avx(auVar174,auVar121);
              auVar15 = vsubps_avx(auVar138,auVar10);
              auVar16 = vsubps_avx(auVar165,auVar11);
              auVar10 = vblendps_avx(auVar81,auVar144,0x80);
              auVar11 = vblendps_avx(auVar58,auVar144,0x80);
              auVar139 = vblendps_avx(auVar93,auVar144,0x80);
              auVar82._0_4_ = auVar174._0_4_ + auVar10._0_4_ * 0.055555556;
              auVar82._4_4_ = auVar174._4_4_ + auVar10._4_4_ * 0.055555556;
              auVar82._8_4_ = auVar174._8_4_ + auVar10._8_4_ * 0.055555556;
              auVar82._12_4_ = auVar174._12_4_ + auVar10._12_4_ * 0.055555556;
              auVar82._16_4_ = auVar174._16_4_ + auVar10._16_4_ * 0.055555556;
              auVar82._20_4_ = auVar174._20_4_ + auVar10._20_4_ * 0.055555556;
              auVar82._24_4_ = auVar174._24_4_ + auVar10._24_4_ * 0.055555556;
              auVar82._28_4_ = auVar174._28_4_ + auVar10._28_4_;
              auVar59._0_4_ = auVar138._0_4_ + auVar11._0_4_ * 0.055555556;
              auVar59._4_4_ = auVar138._4_4_ + auVar11._4_4_ * 0.055555556;
              auVar59._8_4_ = auVar138._8_4_ + auVar11._8_4_ * 0.055555556;
              auVar59._12_4_ = auVar138._12_4_ + auVar11._12_4_ * 0.055555556;
              auVar59._16_4_ = auVar138._16_4_ + auVar11._16_4_ * 0.055555556;
              auVar59._20_4_ = auVar138._20_4_ + auVar11._20_4_ * 0.055555556;
              auVar59._24_4_ = auVar138._24_4_ + auVar11._24_4_ * 0.055555556;
              auVar59._28_4_ = auVar138._28_4_ + auVar11._28_4_;
              auVar94._0_4_ = auVar165._0_4_ + auVar139._0_4_ * 0.055555556;
              auVar94._4_4_ = auVar165._4_4_ + auVar139._4_4_ * 0.055555556;
              auVar94._8_4_ = auVar165._8_4_ + auVar139._8_4_ * 0.055555556;
              auVar94._12_4_ = auVar165._12_4_ + auVar139._12_4_ * 0.055555556;
              auVar94._16_4_ = auVar165._16_4_ + auVar139._16_4_ * 0.055555556;
              auVar94._20_4_ = auVar165._20_4_ + auVar139._20_4_ * 0.055555556;
              auVar94._24_4_ = auVar165._24_4_ + auVar139._24_4_ * 0.055555556;
              auVar94._28_4_ = auVar139._28_4_ + 0.0;
              auVar67._8_4_ = 0x7f800000;
              auVar67._0_8_ = 0x7f8000007f800000;
              auVar67._12_4_ = 0x7f800000;
              auVar67._16_4_ = 0x7f800000;
              auVar67._20_4_ = 0x7f800000;
              auVar67._24_4_ = 0x7f800000;
              auVar67._28_4_ = 0x7f800000;
              auVar10 = vminps_avx(auVar67,auVar174);
              auVar11 = vminps_avx(auVar67,auVar138);
              auVar139 = vminps_avx(auVar121,auVar82);
              auVar144 = vminps_avx(auVar10,auVar139);
              auVar10 = vminps_avx(auVar15,auVar59);
              auVar14 = vminps_avx(auVar11,auVar10);
              auVar10 = vminps_avx(auVar67,auVar165);
              auVar11 = vminps_avx(auVar16,auVar94);
              auVar58 = vminps_avx(auVar10,auVar11);
              auVar171._0_4_ = (fVar142 + auVar66._0_4_) * 0.33333334 + (float)local_348._0_4_;
              auVar171._4_4_ = (fVar149 + auVar66._4_4_) * 0.33333334 + (float)local_348._4_4_;
              auVar171._8_4_ = (fVar151 + auVar66._8_4_) * 0.33333334 + fStack_340;
              auVar171._12_4_ = (fVar153 + auVar66._12_4_) * 0.33333334 + fStack_33c;
              auVar155._0_4_ = (fVar164 + auVar55._0_4_) * 0.33333334;
              auVar155._4_4_ = (fVar167 + auVar55._4_4_) * 0.33333334;
              auVar155._8_4_ = (fVar168 + auVar55._8_4_) * 0.33333334;
              auVar155._12_4_ = (fVar169 + auVar55._12_4_) * 0.33333334;
              local_118 = vsubps_avx(_local_338,auVar155);
              auVar161._8_4_ = 0xff800000;
              auVar161._0_8_ = 0xff800000ff800000;
              auVar161._12_4_ = 0xff800000;
              auVar161._16_4_ = 0xff800000;
              auVar161._20_4_ = 0xff800000;
              auVar161._24_4_ = 0xff800000;
              auVar161._28_4_ = 0xff800000;
              auVar10 = vmaxps_avx(auVar161,auVar174);
              auVar11 = vmaxps_avx(auVar161,auVar138);
              auVar139 = vmaxps_avx(auVar161,auVar165);
              auVar121 = vmaxps_avx(auVar121,auVar82);
              auVar10 = vmaxps_avx(auVar10,auVar121);
              auVar121 = vmaxps_avx(auVar15,auVar59);
              auVar121 = vmaxps_avx(auVar11,auVar121);
              auVar15 = vmaxps_avx(auVar16,auVar94);
              auVar139 = vmaxps_avx(auVar139,auVar15);
              auVar15 = vshufps_avx(auVar144,auVar144,0xb1);
              auVar15 = vminps_avx(auVar144,auVar15);
              auVar16 = vshufpd_avx(auVar15,auVar15,5);
              auVar15 = vminps_avx(auVar15,auVar16);
              auVar51 = vminps_avx(auVar15._0_16_,auVar15._16_16_);
              auVar15 = vshufps_avx(auVar14,auVar14,0xb1);
              auVar15 = vminps_avx(auVar14,auVar15);
              auVar16 = vshufpd_avx(auVar15,auVar15,5);
              auVar15 = vminps_avx(auVar15,auVar16);
              auVar49 = vminps_avx(auVar15._0_16_,auVar15._16_16_);
              auVar49 = vunpcklps_avx(auVar51,auVar49);
              auVar15 = vshufps_avx(auVar58,auVar58,0xb1);
              auVar15 = vminps_avx(auVar58,auVar15);
              auVar16 = vshufpd_avx(auVar15,auVar15,5);
              auVar15 = vminps_avx(auVar15,auVar16);
              auVar51 = vminps_avx(auVar15._0_16_,auVar15._16_16_);
              auVar51 = vinsertps_avx(auVar49,auVar51,0x28);
              auVar15 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar10 = vmaxps_avx(auVar10,auVar15);
              auVar15 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar15);
              auVar49 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar10 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar10 = vmaxps_avx(auVar121,auVar10);
              auVar121 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar121);
              auVar62 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar62 = vunpcklps_avx(auVar49,auVar62);
              auVar10 = vshufps_avx(auVar139,auVar139,0xb1);
              auVar10 = vmaxps_avx(auVar139,auVar10);
              auVar139 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar139);
              auVar49 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar49 = vinsertps_avx(auVar62,auVar49,0x28);
              auVar62 = vshufps_avx(auVar171,auVar171,0);
              auVar63 = vshufps_avx(auVar171,auVar171,0x55);
              local_138._16_16_ = auVar63;
              local_138._0_16_ = auVar63;
              auVar52 = vshufps_avx(auVar171,auVar171,0xaa);
              local_58._16_16_ = auVar52;
              local_58._0_16_ = auVar52;
              auVar54 = vshufps_avx(local_118,local_118,0);
              auVar53 = vshufps_avx(local_118,local_118,0x55);
              auVar56 = vshufps_avx(local_118,local_118,0xaa);
              auVar55 = vshufps_avx(_local_338,_local_338,0);
              auVar79 = vshufps_avx(_local_338,_local_338,0x55);
              auVar74 = vshufps_avx(_local_338,_local_338,0xaa);
              fVar70 = auVar55._0_4_;
              fVar71 = auVar55._4_4_;
              fVar72 = auVar55._8_4_;
              fVar126 = auVar55._12_4_;
              fVar98 = auVar79._0_4_;
              fVar107 = auVar79._4_4_;
              fVar108 = auVar79._8_4_;
              fVar109 = auVar79._12_4_;
              fVar88 = auVar74._0_4_;
              fVar95 = auVar74._4_4_;
              fVar96 = auVar74._8_4_;
              fVar97 = auVar74._12_4_;
              fVar157 = auVar54._0_4_;
              fVar158 = auVar54._4_4_;
              fVar159 = auVar54._8_4_;
              fVar87 = auVar58._28_4_;
              fVar131 = auVar53._0_4_;
              fVar134 = auVar53._4_4_;
              fVar136 = auVar53._8_4_;
              fVar85 = auVar53._12_4_;
              fVar146 = auVar56._0_4_;
              fVar149 = auVar56._4_4_;
              fVar150 = auVar56._8_4_;
              fVar162 = auVar62._0_4_;
              fVar163 = auVar62._4_4_;
              fVar164 = auVar62._8_4_;
              fVar151 = auVar63._0_4_;
              fVar152 = auVar63._4_4_;
              fVar153 = auVar63._8_4_;
              fVar154 = auVar63._12_4_;
              fVar117 = auVar52._0_4_;
              fVar123 = auVar52._4_4_;
              fVar124 = auVar52._8_4_;
              fVar125 = auVar52._12_4_;
              auVar63 = vshufps_avx(_local_348,_local_348,0);
              fVar110 = auVar63._0_4_;
              fVar115 = auVar63._4_4_;
              fVar116 = auVar63._8_4_;
              auVar148._0_4_ =
                   fVar110 * local_2f8 +
                   fVar162 * (float)local_218._0_4_ + fVar157 * local_238 + fVar70 * local_198;
              auVar148._4_4_ =
                   fVar115 * fStack_2f4 +
                   fVar163 * (float)local_218._4_4_ + fVar158 * fStack_234 + fVar71 * fStack_194;
              auVar148._8_4_ =
                   fVar116 * fStack_2f0 +
                   fVar164 * fStack_210 + fVar159 * fStack_230 + fVar72 * fStack_190;
              auVar148._12_4_ =
                   auVar63._12_4_ * fStack_2ec +
                   auVar62._12_4_ * fStack_20c + auVar54._12_4_ * fStack_22c + fVar126 * fStack_18c;
              auVar148._16_4_ =
                   fVar110 * fStack_2e8 +
                   fVar162 * fStack_208 + fVar157 * fStack_228 + fVar70 * fStack_188;
              auVar148._20_4_ =
                   fVar115 * fStack_2e4 +
                   fVar163 * fStack_204 + fVar158 * fStack_224 + fVar71 * fStack_184;
              auVar148._24_4_ =
                   fVar116 * fStack_2e0 +
                   fVar164 * fStack_200 + fVar159 * fStack_220 + fVar72 * fStack_180;
              auVar148._28_4_ = fVar87 + fVar87 + auVar144._28_4_ + 0.0;
              auVar52 = vshufps_avx(_local_348,_local_348,0x55);
              fVar127 = auVar52._0_4_;
              fVar132 = auVar52._4_4_;
              fVar135 = auVar52._8_4_;
              auVar166._0_4_ =
                   fVar127 * local_2f8 +
                   fVar151 * (float)local_218._0_4_ + fVar131 * local_238 + fVar98 * local_198;
              auVar166._4_4_ =
                   fVar132 * fStack_2f4 +
                   fVar152 * (float)local_218._4_4_ + fVar134 * fStack_234 + fVar107 * fStack_194;
              auVar166._8_4_ =
                   fVar135 * fStack_2f0 +
                   fVar153 * fStack_210 + fVar136 * fStack_230 + fVar108 * fStack_190;
              auVar166._12_4_ =
                   auVar52._12_4_ * fStack_2ec +
                   fVar154 * fStack_20c + fVar85 * fStack_22c + fVar109 * fStack_18c;
              auVar166._16_4_ =
                   fVar127 * fStack_2e8 +
                   fVar151 * fStack_208 + fVar131 * fStack_228 + fVar98 * fStack_188;
              auVar166._20_4_ =
                   fVar132 * fStack_2e4 +
                   fVar152 * fStack_204 + fVar134 * fStack_224 + fVar107 * fStack_184;
              auVar166._24_4_ =
                   fVar135 * fStack_2e0 +
                   fVar153 * fStack_200 + fVar136 * fStack_220 + fVar108 * fStack_180;
              auVar166._28_4_ = fVar154 + fVar87 + fVar87 + auVar11._28_4_;
              auVar53 = vshufps_avx(_local_348,_local_348,0xaa);
              fVar137 = auVar53._0_4_;
              fVar141 = auVar53._4_4_;
              fVar142 = auVar53._8_4_;
              auVar145._0_4_ =
                   fVar137 * local_2f8 +
                   fVar117 * (float)local_218._0_4_ + fVar146 * local_238 + fVar88 * local_198;
              auVar145._4_4_ =
                   fVar141 * fStack_2f4 +
                   fVar123 * (float)local_218._4_4_ + fVar149 * fStack_234 + fVar95 * fStack_194;
              auVar145._8_4_ =
                   fVar142 * fStack_2f0 +
                   fVar124 * fStack_210 + fVar150 * fStack_230 + fVar96 * fStack_190;
              auVar145._12_4_ =
                   auVar53._12_4_ * fStack_2ec +
                   fVar125 * fStack_20c + auVar56._12_4_ * fStack_22c + fVar97 * fStack_18c;
              auVar145._16_4_ =
                   fVar137 * fStack_2e8 +
                   fVar117 * fStack_208 + fVar146 * fStack_228 + fVar88 * fStack_188;
              auVar145._20_4_ =
                   fVar141 * fStack_2e4 +
                   fVar123 * fStack_204 + fVar149 * fStack_224 + fVar95 * fStack_184;
              auVar145._24_4_ =
                   fVar142 * fStack_2e0 +
                   fVar124 * fStack_200 + fVar150 * fStack_220 + fVar96 * fStack_180;
              auVar145._28_4_ = fVar87 + fVar87 + auVar14._28_4_ + 0.0;
              fVar87 = fVar109 + fVar126 + fVar125;
              fVar86 = fVar109 + fVar85 + fVar109;
              auVar60._0_4_ =
                   fVar110 * local_1d8 +
                   fVar162 * local_1b8 + fVar157 * local_d8 + local_f8 * fVar70;
              auVar60._4_4_ =
                   fVar115 * fStack_1d4 +
                   fVar163 * fStack_1b4 + fVar158 * fStack_d4 + fStack_f4 * fVar71;
              auVar60._8_4_ =
                   fVar116 * fStack_1d0 +
                   fVar164 * fStack_1b0 + fVar159 * fStack_d0 + fStack_f0 * fVar72;
              auVar60._12_4_ =
                   auVar63._12_4_ * fStack_1cc +
                   auVar62._12_4_ * fStack_1ac + auVar54._12_4_ * fStack_cc + fStack_ec * fVar126;
              auVar60._16_4_ =
                   fVar110 * fStack_1c8 +
                   fVar162 * fStack_1a8 + fVar157 * fStack_c8 + fStack_e8 * fVar70;
              auVar60._20_4_ =
                   fVar115 * fStack_1c4 +
                   fVar163 * fStack_1a4 + fVar158 * fStack_c4 + fStack_e4 * fVar71;
              auVar60._24_4_ =
                   fVar116 * fStack_1c0 +
                   fVar164 * fStack_1a0 + fVar159 * fStack_c0 + fStack_e0 * fVar72;
              auVar60._28_4_ = fStack_19c + fVar87;
              auVar68._0_4_ =
                   fVar127 * local_1d8 +
                   local_1b8 * fVar151 + fVar131 * local_d8 + local_f8 * fVar98;
              auVar68._4_4_ =
                   fVar132 * fStack_1d4 +
                   fStack_1b4 * fVar152 + fVar134 * fStack_d4 + fStack_f4 * fVar107;
              auVar68._8_4_ =
                   fVar135 * fStack_1d0 +
                   fStack_1b0 * fVar153 + fVar136 * fStack_d0 + fStack_f0 * fVar108;
              auVar68._12_4_ =
                   auVar52._12_4_ * fStack_1cc +
                   fStack_1ac * fVar154 + fVar85 * fStack_cc + fStack_ec * fVar109;
              auVar68._16_4_ =
                   fVar127 * fStack_1c8 +
                   fStack_1a8 * fVar151 + fVar131 * fStack_c8 + fStack_e8 * fVar98;
              auVar68._20_4_ =
                   fVar132 * fStack_1c4 +
                   fStack_1a4 * fVar152 + fVar134 * fStack_c4 + fStack_e4 * fVar107;
              auVar68._24_4_ =
                   fVar135 * fStack_1c0 +
                   fStack_1a0 * fVar153 + fVar136 * fStack_c0 + fStack_e0 * fVar108;
              auVar68._28_4_ = fVar87 + fVar86;
              auVar83._0_4_ =
                   fVar137 * local_1d8 +
                   local_1b8 * fVar117 + fVar146 * local_d8 + local_f8 * fVar88;
              auVar83._4_4_ =
                   fVar141 * fStack_1d4 +
                   fStack_1b4 * fVar123 + fVar149 * fStack_d4 + fStack_f4 * fVar95;
              auVar83._8_4_ =
                   fVar142 * fStack_1d0 +
                   fStack_1b0 * fVar124 + fVar150 * fStack_d0 + fStack_f0 * fVar96;
              auVar83._12_4_ =
                   auVar53._12_4_ * fStack_1cc +
                   fStack_1ac * fVar125 + auVar56._12_4_ * fStack_cc + fStack_ec * fVar97;
              auVar83._16_4_ =
                   fVar137 * fStack_1c8 +
                   fStack_1a8 * fVar117 + fVar146 * fStack_c8 + fStack_e8 * fVar88;
              auVar83._20_4_ =
                   fVar141 * fStack_1c4 +
                   fStack_1a4 * fVar123 + fVar149 * fStack_c4 + fStack_e4 * fVar95;
              auVar83._24_4_ =
                   fVar142 * fStack_1c0 +
                   fStack_1a0 * fVar124 + fVar150 * fStack_c0 + fStack_e0 * fVar96;
              auVar83._28_4_ = fVar86 + fVar109 + fVar97 + fVar109;
              auVar10 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,1);
              auVar11 = vblendps_avx(auVar68,ZEXT832(0) << 0x20,1);
              auVar121 = ZEXT832(0) << 0x20;
              auVar139 = vblendps_avx(auVar83,auVar121,1);
              auVar15._4_4_ = auVar10._4_4_ * 0.055555556;
              auVar15._0_4_ = auVar10._0_4_ * 0.055555556;
              auVar15._8_4_ = auVar10._8_4_ * 0.055555556;
              auVar15._12_4_ = auVar10._12_4_ * 0.055555556;
              auVar15._16_4_ = auVar10._16_4_ * 0.055555556;
              auVar15._20_4_ = auVar10._20_4_ * 0.055555556;
              auVar15._24_4_ = auVar10._24_4_ * 0.055555556;
              auVar15._28_4_ = auVar10._28_4_;
              auVar144._4_4_ = auVar11._4_4_ * 0.055555556;
              auVar144._0_4_ = auVar11._0_4_ * 0.055555556;
              auVar144._8_4_ = auVar11._8_4_ * 0.055555556;
              auVar144._12_4_ = auVar11._12_4_ * 0.055555556;
              auVar144._16_4_ = auVar11._16_4_ * 0.055555556;
              auVar144._20_4_ = auVar11._20_4_ * 0.055555556;
              auVar144._24_4_ = auVar11._24_4_ * 0.055555556;
              auVar144._28_4_ = auVar11._28_4_;
              auVar14._4_4_ = auVar139._4_4_ * 0.055555556;
              auVar14._0_4_ = auVar139._0_4_ * 0.055555556;
              auVar14._8_4_ = auVar139._8_4_ * 0.055555556;
              auVar14._12_4_ = auVar139._12_4_ * 0.055555556;
              auVar14._16_4_ = auVar139._16_4_ * 0.055555556;
              auVar14._20_4_ = auVar139._20_4_ * 0.055555556;
              auVar14._24_4_ = auVar139._24_4_ * 0.055555556;
              auVar14._28_4_ = auVar139._28_4_;
              auVar58 = vsubps_avx(auVar148,auVar15);
              auVar16 = vsubps_avx(auVar166,auVar144);
              auVar59 = vsubps_avx(auVar145,auVar14);
              auVar10 = vblendps_avx(auVar60,auVar121,0x80);
              auVar11 = vblendps_avx(auVar68,auVar121,0x80);
              auVar139 = vblendps_avx(auVar83,auVar121,0x80);
              auVar61._0_4_ = auVar148._0_4_ + auVar10._0_4_ * 0.055555556;
              auVar61._4_4_ = auVar148._4_4_ + auVar10._4_4_ * 0.055555556;
              auVar61._8_4_ = auVar148._8_4_ + auVar10._8_4_ * 0.055555556;
              auVar61._12_4_ = auVar148._12_4_ + auVar10._12_4_ * 0.055555556;
              auVar61._16_4_ = auVar148._16_4_ + auVar10._16_4_ * 0.055555556;
              auVar61._20_4_ = auVar148._20_4_ + auVar10._20_4_ * 0.055555556;
              auVar61._24_4_ = auVar148._24_4_ + auVar10._24_4_ * 0.055555556;
              auVar61._28_4_ = auVar148._28_4_ + auVar10._28_4_;
              auVar69._0_4_ = auVar166._0_4_ + auVar11._0_4_ * 0.055555556;
              auVar69._4_4_ = auVar166._4_4_ + auVar11._4_4_ * 0.055555556;
              auVar69._8_4_ = auVar166._8_4_ + auVar11._8_4_ * 0.055555556;
              auVar69._12_4_ = auVar166._12_4_ + auVar11._12_4_ * 0.055555556;
              auVar69._16_4_ = auVar166._16_4_ + auVar11._16_4_ * 0.055555556;
              auVar69._20_4_ = auVar166._20_4_ + auVar11._20_4_ * 0.055555556;
              auVar69._24_4_ = auVar166._24_4_ + auVar11._24_4_ * 0.055555556;
              auVar69._28_4_ = auVar166._28_4_ + auVar11._28_4_;
              auVar84._0_4_ = auVar145._0_4_ + auVar139._0_4_ * 0.055555556;
              auVar84._4_4_ = auVar145._4_4_ + auVar139._4_4_ * 0.055555556;
              auVar84._8_4_ = auVar145._8_4_ + auVar139._8_4_ * 0.055555556;
              auVar84._12_4_ = auVar145._12_4_ + auVar139._12_4_ * 0.055555556;
              auVar84._16_4_ = auVar145._16_4_ + auVar139._16_4_ * 0.055555556;
              auVar84._20_4_ = auVar145._20_4_ + auVar139._20_4_ * 0.055555556;
              auVar84._24_4_ = auVar145._24_4_ + auVar139._24_4_ * 0.055555556;
              auVar84._28_4_ = auVar145._28_4_ + auVar139._28_4_;
              auVar139._8_4_ = 0x7f800000;
              auVar139._0_8_ = 0x7f8000007f800000;
              auVar139._12_4_ = 0x7f800000;
              auVar139._16_4_ = 0x7f800000;
              auVar139._20_4_ = 0x7f800000;
              auVar139._24_4_ = 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar10 = vminps_avx(auVar139,auVar148);
              auVar11 = vminps_avx(auVar139,auVar166);
              auVar139 = vminps_avx(auVar139,auVar145);
              auVar121 = vminps_avx(auVar58,auVar61);
              auVar15 = vminps_avx(auVar10,auVar121);
              auVar10 = vminps_avx(auVar16,auVar69);
              auVar144 = vminps_avx(auVar11,auVar10);
              auVar10 = vminps_avx(auVar59,auVar84);
              auVar14 = vminps_avx(auVar139,auVar10);
              auVar10 = vmaxps_avx(auVar58,auVar61);
              auVar156._8_4_ = 0xff800000;
              auVar156._0_8_ = 0xff800000ff800000;
              auVar156._12_4_ = 0xff800000;
              auVar156._16_4_ = 0xff800000;
              auVar156._20_4_ = 0xff800000;
              auVar156._24_4_ = 0xff800000;
              auVar156._28_4_ = 0xff800000;
              auVar11 = vmaxps_avx(auVar156,auVar148);
              auVar10 = vmaxps_avx(auVar11,auVar10);
              auVar11 = vmaxps_avx(auVar16,auVar69);
              auVar139 = vmaxps_avx(auVar156,auVar166);
              auVar11 = vmaxps_avx(auVar139,auVar11);
              auVar139 = vmaxps_avx(auVar59,auVar84);
              auVar121 = vmaxps_avx(auVar156,auVar145);
              auVar139 = vmaxps_avx(auVar121,auVar139);
              auVar121 = vshufps_avx(auVar15,auVar15,0xb1);
              auVar121 = vminps_avx(auVar15,auVar121);
              auVar15 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar15);
              auVar62 = vminps_avx(auVar121._0_16_,auVar121._16_16_);
              auVar121 = vshufps_avx(auVar144,auVar144,0xb1);
              auVar121 = vminps_avx(auVar144,auVar121);
              auVar15 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar15);
              auVar63 = vminps_avx(auVar121._0_16_,auVar121._16_16_);
              auVar63 = vunpcklps_avx(auVar62,auVar63);
              auVar121 = vshufps_avx(auVar14,auVar14,0xb1);
              auVar121 = vminps_avx(auVar14,auVar121);
              auVar140 = ZEXT864(0) << 0x20;
              auVar122 = ZEXT864(0) << 0x20;
              auVar15 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar15);
              auVar62 = vminps_avx(auVar121._0_16_,auVar121._16_16_);
              auVar113._8_4_ = 0xddccb9a2;
              auVar113._0_8_ = 0xddccb9a2ddccb9a2;
              auVar113._12_4_ = 0xddccb9a2;
              auVar114 = ZEXT1664(auVar113);
              auVar62 = vinsertps_avx(auVar63,auVar62,0x28);
              auVar63 = vminps_avx(auVar51,auVar62);
              auVar121 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar10 = vmaxps_avx(auVar10,auVar121);
              auVar121 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar121);
              auVar51 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar10 = vshufps_avx(auVar11,auVar11,0xb1);
              auVar10 = vmaxps_avx(auVar11,auVar10);
              auVar11 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar11);
              auVar62 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar105._8_4_ = 0x5dccb9a2;
              auVar105._0_8_ = 0x5dccb9a25dccb9a2;
              auVar105._12_4_ = 0x5dccb9a2;
              auVar106 = ZEXT1664(auVar105);
              auVar62 = vunpcklps_avx(auVar51,auVar62);
              auVar10 = vshufps_avx(auVar139,auVar139,0xb1);
              auVar10 = vmaxps_avx(auVar139,auVar10);
              auVar11 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar11);
              auVar51 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar51 = vinsertps_avx(auVar62,auVar51,0x28);
              auVar49 = vmaxps_avx(auVar49,auVar51);
              auVar51 = vcmpps_avx(auVar63,auVar113,6);
              auVar49 = vcmpps_avx(auVar49,auVar105,1);
              auVar51 = vandps_avx(auVar49,auVar51);
              uVar37 = vmovmskps_avx(auVar51);
              if ((~(byte)uVar37 & 7) != 0) break;
              uVar43 = uVar43 + 1;
              lVar46 = lVar46 + 0x38;
              bVar9 = (ulong)(long)(int)uVar44 < uVar43;
            } while (uVar43 <= (ulong)(long)(int)uVar44);
          }
          if (bVar9) {
            local_250.primID = &local_240;
            fVar133 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                      super_CurveGeometry.super_Geometry.time_range.lower;
            local_238 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                        super_CurveGeometry.super_Geometry.time_range.upper - fVar133;
            fVar87 = ((float)local_1e8._0_4_ - fVar133) / local_238;
            local_238 = ((float)local_1f8._0_4_ - fVar133) / local_238;
            local_1d8 = fVar87;
            fVar87 = fVar2 * fVar87;
            fVar133 = fVar2 * local_238;
            auVar49 = vroundss_avx(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87),9);
            auVar62 = vroundss_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),10);
            auVar50 = vmaxss_avx(auVar49,auVar122._0_16_);
            local_218._0_4_ = auVar50._0_4_;
            auVar51 = vminss_avx(auVar62,ZEXT416((uint)fVar2));
            iVar39 = (int)auVar50._0_4_;
            fVar70 = auVar51._0_4_;
            uVar4 = (int)auVar49._0_4_;
            if ((int)auVar49._0_4_ < 0) {
              uVar4 = 0xffffffff;
            }
            iVar48 = (int)fVar2 + 1;
            if ((int)auVar62._0_4_ < (int)fVar2 + 1) {
              iVar48 = (int)auVar62._0_4_;
            }
            local_250.this = this;
            local_240 = uVar47;
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_158.field_1,&local_250,(long)iVar39);
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_178.field_1,&local_250,(long)(int)fVar70);
            fVar87 = fVar87 - (float)local_218._0_4_;
            if (iVar48 - uVar4 == 1) {
              auVar50 = vmaxss_avx(ZEXT416((uint)fVar87),ZEXT816(0) << 0x40);
              auVar51 = vshufps_avx(auVar50,auVar50,0);
              auVar50 = ZEXT416((uint)(1.0 - auVar50._0_4_));
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              auVar128._0_4_ = auVar51._0_4_ * local_178.m128[0] + auVar50._0_4_ * local_158.m128[0]
              ;
              auVar128._4_4_ = auVar51._4_4_ * local_178.m128[1] + auVar50._4_4_ * local_158.m128[1]
              ;
              auVar128._8_4_ = auVar51._8_4_ * local_178.m128[2] + auVar50._8_4_ * local_158.m128[2]
              ;
              auVar128._12_4_ =
                   auVar51._12_4_ * local_178.m128[3] + auVar50._12_4_ * local_158.m128[3];
              auVar143._0_4_ = auVar51._0_4_ * local_168 + auVar50._0_4_ * local_148;
              auVar143._4_4_ = auVar51._4_4_ * fStack_164 + auVar50._4_4_ * fStack_144;
              auVar143._8_4_ = auVar51._8_4_ * fStack_160 + auVar50._8_4_ * fStack_140;
              auVar143._12_4_ = auVar51._12_4_ * fStack_15c + auVar50._12_4_ * fStack_13c;
              auVar50 = vmaxss_avx(ZEXT416((uint)(fVar70 - fVar133)),ZEXT816(0) << 0x40);
              auVar51 = vshufps_avx(auVar50,auVar50,0);
              auVar50 = ZEXT416((uint)(1.0 - auVar50._0_4_));
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              auVar73._0_4_ = auVar50._0_4_ * local_178.m128[0] + auVar51._0_4_ * local_158.m128[0];
              auVar73._4_4_ = auVar50._4_4_ * local_178.m128[1] + auVar51._4_4_ * local_158.m128[1];
              auVar73._8_4_ = auVar50._8_4_ * local_178.m128[2] + auVar51._8_4_ * local_158.m128[2];
              auVar73._12_4_ =
                   auVar50._12_4_ * local_178.m128[3] + auVar51._12_4_ * local_158.m128[3];
              auVar147._0_4_ = auVar50._0_4_ * local_168 + auVar51._0_4_ * local_148;
              auVar147._4_4_ = auVar50._4_4_ * fStack_164 + auVar51._4_4_ * fStack_144;
              auVar147._8_4_ = auVar50._8_4_ * fStack_160 + auVar51._8_4_ * fStack_140;
              auVar147._12_4_ = auVar50._12_4_ * fStack_15c + auVar51._12_4_ * fStack_13c;
              auVar50 = ZEXT816(0);
              auVar140 = ZEXT864(0);
            }
            else {
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_78.field_1,&local_250,(long)(iVar39 + 1));
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_250,(long)((int)fVar70 + -1));
              auVar50 = vmaxss_avx(ZEXT416((uint)fVar87),ZEXT816(0) << 0x40);
              auVar51 = vshufps_avx(auVar50,auVar50,0);
              auVar50 = ZEXT416((uint)(1.0 - auVar50._0_4_));
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              auVar128._0_4_ = auVar51._0_4_ * local_78.m128[0] + auVar50._0_4_ * local_158.m128[0];
              auVar128._4_4_ = auVar51._4_4_ * local_78.m128[1] + auVar50._4_4_ * local_158.m128[1];
              auVar128._8_4_ = auVar51._8_4_ * local_78.m128[2] + auVar50._8_4_ * local_158.m128[2];
              auVar128._12_4_ =
                   auVar51._12_4_ * local_78.m128[3] + auVar50._12_4_ * local_158.m128[3];
              auVar143._0_4_ = auVar51._0_4_ * local_68 + auVar50._0_4_ * local_148;
              auVar143._4_4_ = auVar51._4_4_ * fStack_64 + auVar50._4_4_ * fStack_144;
              auVar143._8_4_ = auVar51._8_4_ * fStack_60 + auVar50._8_4_ * fStack_140;
              auVar143._12_4_ = auVar51._12_4_ * fStack_5c + auVar50._12_4_ * fStack_13c;
              auVar50 = vmaxss_avx(ZEXT416((uint)(fVar70 - fVar133)),ZEXT816(0) << 0x40);
              auVar51 = vshufps_avx(auVar50,auVar50,0);
              auVar50 = ZEXT416((uint)(1.0 - auVar50._0_4_));
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              auVar73._0_4_ = auVar51._0_4_ * local_98.m128[0] + auVar50._0_4_ * local_178.m128[0];
              auVar73._4_4_ = auVar51._4_4_ * local_98.m128[1] + auVar50._4_4_ * local_178.m128[1];
              auVar73._8_4_ = auVar51._8_4_ * local_98.m128[2] + auVar50._8_4_ * local_178.m128[2];
              auVar73._12_4_ =
                   auVar51._12_4_ * local_98.m128[3] + auVar50._12_4_ * local_178.m128[3];
              auVar147._0_4_ = auVar51._0_4_ * local_88 + auVar50._0_4_ * local_168;
              auVar147._4_4_ = auVar51._4_4_ * fStack_84 + auVar50._4_4_ * fStack_164;
              auVar147._8_4_ = auVar51._8_4_ * fStack_80 + auVar50._8_4_ * fStack_160;
              auVar147._12_4_ = auVar51._12_4_ * fStack_7c + auVar50._12_4_ * fStack_15c;
              if ((int)(uVar4 + 1) < iVar48) {
                local_1b8 = local_238 - local_1d8;
                itime = (size_t)(uVar4 + 1);
                iVar48 = ~uVar4 + iVar48;
                do {
                  _local_218 = auVar147;
                  auVar57._0_4_ = ((float)(int)itime / fVar2 - local_1d8) / local_1b8;
                  auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar50 = vshufps_avx(auVar57,auVar57,0);
                  local_348._0_4_ = auVar73._0_4_;
                  local_348._4_4_ = auVar73._4_4_;
                  fStack_340 = auVar73._8_4_;
                  fStack_33c = auVar73._12_4_;
                  auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - auVar57._0_4_)),
                                        ZEXT416((uint)(1.0 - auVar57._0_4_)),0);
                  fVar133 = auVar128._4_4_;
                  fVar87 = auVar128._8_4_;
                  fVar70 = auVar128._12_4_;
                  local_238 = auVar50._0_4_ * (float)local_348._0_4_ +
                              auVar128._0_4_ * auVar51._0_4_;
                  fStack_234 = auVar50._4_4_ * (float)local_348._4_4_ + fVar133 * auVar51._4_4_;
                  fStack_230 = auVar50._8_4_ * fStack_340 + fVar87 * auVar51._8_4_;
                  fStack_22c = auVar50._12_4_ * fStack_33c + fVar70 * auVar51._12_4_;
                  fVar71 = auVar143._4_4_;
                  fVar72 = auVar143._8_4_;
                  fVar126 = auVar143._12_4_;
                  local_198 = local_218._0_4_ * auVar50._0_4_ + auVar143._0_4_ * auVar51._0_4_;
                  fStack_194 = local_218._4_4_ * auVar50._4_4_ + fVar71 * auVar51._4_4_;
                  fStack_190 = local_218._8_4_ * auVar50._8_4_ + fVar72 * auVar51._8_4_;
                  fStack_18c = local_218._12_4_ * auVar50._12_4_ + fVar126 * auVar51._12_4_;
                  linearBounds::anon_class_16_2_07cfa4d6::operator()
                            ((BBox3fa *)&local_b8.field_1,&local_250,itime);
                  auVar50 = ZEXT816(0) << 0x40;
                  auVar17._4_4_ = fStack_234;
                  auVar17._0_4_ = local_238;
                  auVar17._8_4_ = fStack_230;
                  auVar17._12_4_ = fStack_22c;
                  auVar51 = vsubps_avx((undefined1  [16])local_b8,auVar17);
                  auVar18._4_4_ = fStack_194;
                  auVar18._0_4_ = local_198;
                  auVar18._8_4_ = fStack_190;
                  auVar18._12_4_ = fStack_18c;
                  auVar62 = vsubps_avx(local_a8,auVar18);
                  auVar49 = vminps_avx(auVar51,auVar50);
                  auVar51 = vmaxps_avx(auVar62,auVar50);
                  auVar128._0_4_ = auVar128._0_4_ + auVar49._0_4_;
                  auVar128._4_4_ = fVar133 + auVar49._4_4_;
                  auVar128._8_4_ = fVar87 + auVar49._8_4_;
                  auVar128._12_4_ = fVar70 + auVar49._12_4_;
                  auVar73._0_4_ = (float)local_348._0_4_ + auVar49._0_4_;
                  auVar73._4_4_ = (float)local_348._4_4_ + auVar49._4_4_;
                  auVar73._8_4_ = fStack_340 + auVar49._8_4_;
                  auVar73._12_4_ = fStack_33c + auVar49._12_4_;
                  auVar143._0_4_ = auVar143._0_4_ + auVar51._0_4_;
                  auVar143._4_4_ = fVar71 + auVar51._4_4_;
                  auVar143._8_4_ = fVar72 + auVar51._8_4_;
                  auVar143._12_4_ = fVar126 + auVar51._12_4_;
                  auVar147._0_4_ = (float)local_218._0_4_ + auVar51._0_4_;
                  auVar147._4_4_ = (float)local_218._4_4_ + auVar51._4_4_;
                  auVar147._8_4_ = fStack_210 + auVar51._8_4_;
                  auVar147._12_4_ = fStack_20c + auVar51._12_4_;
                  itime = itime + 1;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              else {
                auVar50 = ZEXT816(0) << 0x40;
              }
              auVar140 = ZEXT1664(auVar50);
              auVar50 = ZEXT816(0) << 0x20;
            }
            auVar122 = ZEXT1664(auVar50 << 0x20);
            auVar50 = vcmpps_avx(auVar128,auVar143,2);
            uVar37 = vmovmskps_avx(auVar50);
            auVar106 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
            auVar114 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
            if ((~(byte)uVar37 & 7) == 0) {
              auVar50 = vcmpps_avx(auVar73,auVar147,2);
              uVar37 = vmovmskps_avx(auVar50);
              if ((~(byte)uVar37 & 7) == 0) {
                auVar50 = vminps_avx(auVar128,auVar73);
                aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                         vinsertps_avx(auVar50,ZEXT416(geomID),0x30);
                auVar50 = vmaxps_avx(auVar143,auVar147);
                aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                         vinsertps_avx(auVar50,ZEXT416((uint)uVar47),0x30);
                auVar80._0_4_ = aVar12.x + aVar13.x;
                auVar80._4_4_ = aVar12.y + aVar13.y;
                auVar80._8_4_ = aVar12.z + aVar13.z;
                auVar80._12_4_ = aVar12.field_3.w + aVar13.field_3.w;
                local_2a8 = vminps_avx(local_2a8,(undefined1  [16])aVar12);
                local_2b8 = vmaxps_avx(local_2b8,(undefined1  [16])aVar13);
                local_2c8 = vminps_avx(local_2c8,auVar80);
                local_2d8 = vmaxps_avx(local_2d8,auVar80);
                local_310 = local_310 + 1;
                prims[local_308].lower.field_0.field_1 = aVar12;
                prims[local_308].upper.field_0.field_1 = aVar13;
                local_308 = local_308 + 1;
              }
            }
          }
        }
        uVar47 = uVar47 + 1;
      } while (uVar47 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_2a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_2a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_2b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_2b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_2c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_2c8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_2d8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_2d8._8_8_;
    __return_storage_ptr__->end = local_310;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }